

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magics.cpp
# Opt level: O2

U64 magics::attacks<(Piece)2>(Square *s,U64 *block)

{
  Square SVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int sqs;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  allocator_type local_eb;
  allocator_type local_ea;
  allocator_type local_e9;
  int *local_e8;
  U64 tmp;
  Square local_d8 [6];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  steps;
  int to;
  undefined4 uStack_a4;
  pointer piStack_a0;
  pointer local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  int local_48 [6];
  
  local_88 = 0;
  uStack_80 = 0;
  local_98 = (pointer)0x0;
  uStack_90 = 0;
  _to = (pointer)0x0;
  piStack_a0 = (pointer)0x0;
  local_d8[0] = ~G1;
  local_d8[1] = H1;
  local_d8[2] = ~A2;
  local_d8[3] = B2;
  __l._M_len = 4;
  __l._M_array = (iterator)local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_e9);
  local_48[0] = -1;
  local_48[1] = 1;
  local_48[2] = -8;
  local_48[3] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l_00,&local_ea);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&to;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&steps,__l_01,&local_eb);
  lVar8 = 0x48;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)((long)&to + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  local_e8 = steps.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  uVar3 = 0;
  for (piVar6 = steps.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != local_e8; piVar6 = piVar6 + 1) {
    uVar9 = 0;
    tmp = uVar3;
    for (uVar7 = 1; ((*block & uVar9) == 0 && (uVar7 < 8)); uVar7 = uVar7 + 1) {
      SVar1 = *s;
      uVar4 = *piVar6 * uVar7 + SVar1;
      _to = (pointer)CONCAT44(uStack_a4,uVar4);
      if (uVar4 < 0x40) {
        uVar5 = ((int)SVar1 >> 3) - (uVar4 >> 3);
        uVar4 = -uVar5;
        if (0 < (int)uVar5) {
          uVar4 = uVar5;
        }
        if (uVar4 < 8) {
          local_d8[0] = SVar1;
          bVar2 = util::on_diagonal((int *)local_d8,&to);
          if (bVar2) {
            uVar9 = uVar9 | 1L << ((ulong)_to & 0x3f);
          }
        }
      }
    }
    uVar3 = tmp | uVar9;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&steps);
  return uVar3;
}

Assistant:

U64 magics::attacks(const Square& s, const U64& block) {
	std::vector< std::vector<int> > steps =
	{ {}, // pawn
		{}, // knight
		{-7, 7, -9, 9}, // bishop
		{-1, 1, -8, 8}  // rook
	};
	U64 bm = 0ULL;
	for (auto& step : steps[p]) {
		U64 tmp = 0ULL;
		int sqs = 1;

		while ((tmp & block) == 0ULL && sqs < 8) {
			int to = s + (sqs++) * step;
			if (util::on_board(to) &&
				util::col_dist(s, to) <= 7 &&
				util::row_dist(s, to) <= 7 &&
				((p == Piece::bishop && util::on_diagonal(s, to)) ||
					(p == Piece::rook && (util::same_row(s, to) || util::same_col(s, to))))) {
				tmp |= (1ULL << to);
			}
		}
		bm |= tmp;
	}
	return bm;
}